

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteVer.c
# Opt level: O3

void Bac_ManWriteVerilogNtk(Bac_Ntk_t *p,int fUseAssign)

{
  ulong uVar1;
  char cVar2;
  byte bVar3;
  uint uVar4;
  Vec_Str_t *pVVar5;
  int *piVar6;
  size_t sVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  char *pcVar12;
  size_t sVar13;
  char *pcVar14;
  ulong uVar15;
  int i_6;
  ulong uVar16;
  int i_7;
  long lVar17;
  int i_4;
  int iVar18;
  ulong uVar19;
  int i;
  long lVar20;
  long lVar21;
  long local_40;
  
  if ((p->vFanin).nSize != (p->vType).nSize) {
    __assert_fail("Vec_IntSize(&p->vFanin) == Bac_NtkObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                  ,0x24b,"void Bac_ManWriteVerilogNtk(Bac_Ntk_t *, int)");
  }
  pVVar5 = p->pDesign->vOut;
  lVar20 = 0;
  do {
    cVar2 = "module "[lVar20];
    uVar9 = pVVar5->nSize;
    if (uVar9 == pVVar5->nCap) {
      if ((int)uVar9 < 0x10) {
        if (pVVar5->pArray == (char *)0x0) {
          pcVar12 = (char *)malloc(0x10);
        }
        else {
          pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
        }
        pVVar5->pArray = pcVar12;
        pVVar5->nCap = 0x10;
      }
      else {
        sVar13 = (ulong)uVar9 * 2;
        if (pVVar5->pArray == (char *)0x0) {
          pcVar12 = (char *)malloc(sVar13);
        }
        else {
          pcVar12 = (char *)realloc(pVVar5->pArray,sVar13);
        }
        pVVar5->pArray = pcVar12;
        pVVar5->nCap = (int)sVar13;
      }
    }
    else {
      pcVar12 = pVVar5->pArray;
    }
    iVar18 = pVVar5->nSize;
    pVVar5->nSize = iVar18 + 1;
    pcVar12[iVar18] = cVar2;
    lVar20 = lVar20 + 1;
  } while (lVar20 != 7);
  pcVar12 = Abc_NamStr(p->pDesign->pStrs,p->NameId);
  sVar13 = strlen(pcVar12);
  if (0 < (int)(uint)sVar13) {
    uVar19 = 0;
    do {
      cVar2 = pcVar12[uVar19];
      uVar9 = pVVar5->nSize;
      if (uVar9 == pVVar5->nCap) {
        if ((int)uVar9 < 0x10) {
          if (pVVar5->pArray == (char *)0x0) {
            pcVar14 = (char *)malloc(0x10);
          }
          else {
            pcVar14 = (char *)realloc(pVVar5->pArray,0x10);
          }
          pVVar5->pArray = pcVar14;
          pVVar5->nCap = 0x10;
        }
        else {
          sVar7 = (ulong)uVar9 * 2;
          if (pVVar5->pArray == (char *)0x0) {
            pcVar14 = (char *)malloc(sVar7);
          }
          else {
            pcVar14 = (char *)realloc(pVVar5->pArray,sVar7);
          }
          pVVar5->pArray = pcVar14;
          pVVar5->nCap = (int)sVar7;
        }
      }
      else {
        pcVar14 = pVVar5->pArray;
      }
      iVar18 = pVVar5->nSize;
      pVVar5->nSize = iVar18 + 1;
      pcVar14[iVar18] = cVar2;
      uVar19 = uVar19 + 1;
    } while (((uint)sVar13 & 0x7fffffff) != uVar19);
  }
  lVar20 = 0;
  do {
    cVar2 = "module %s (\n    "[lVar20 + 9];
    uVar9 = pVVar5->nSize;
    if (uVar9 == pVVar5->nCap) {
      if ((int)uVar9 < 0x10) {
        if (pVVar5->pArray == (char *)0x0) {
          pcVar12 = (char *)malloc(0x10);
        }
        else {
          pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
        }
        pVVar5->pArray = pcVar12;
        pVVar5->nCap = 0x10;
      }
      else {
        sVar13 = (ulong)uVar9 * 2;
        if (pVVar5->pArray == (char *)0x0) {
          pcVar12 = (char *)malloc(sVar13);
        }
        else {
          pcVar12 = (char *)realloc(pVVar5->pArray,sVar13);
        }
        pVVar5->pArray = pcVar12;
        pVVar5->nCap = (int)sVar13;
      }
    }
    else {
      pcVar12 = pVVar5->pArray;
    }
    iVar18 = pVVar5->nSize;
    pVVar5->nSize = iVar18 + 1;
    pcVar12[iVar18] = cVar2;
    lVar20 = lVar20 + 1;
  } while (lVar20 != 7);
  iVar18 = (p->vInfo).nSize;
  if (2 < iVar18) {
    iVar10 = pVVar5->nSize;
    lVar20 = 0;
    do {
      uVar9 = (p->vInfo).pArray[lVar20];
      if ((int)uVar9 < 0) goto LAB_003a33bd;
      if ((uVar9 & 3) != 0) {
        if (lVar20 != 0) {
          lVar21 = 0;
          do {
            cVar2 = "    \"%s\", "[lVar21 + 8];
            uVar9 = pVVar5->nSize;
            if (uVar9 == pVVar5->nCap) {
              if ((int)uVar9 < 0x10) {
                if (pVVar5->pArray == (char *)0x0) {
                  pcVar12 = (char *)malloc(0x10);
                }
                else {
                  pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
                }
                pVVar5->pArray = pcVar12;
                pVVar5->nCap = 0x10;
              }
              else {
                sVar13 = (ulong)uVar9 * 2;
                if (pVVar5->pArray == (char *)0x0) {
                  pcVar12 = (char *)malloc(sVar13);
                }
                else {
                  pcVar12 = (char *)realloc(pVVar5->pArray,sVar13);
                }
                pVVar5->pArray = pcVar12;
                pVVar5->nCap = (int)sVar13;
              }
            }
            else {
              pcVar12 = pVVar5->pArray;
            }
            iVar18 = pVVar5->nSize;
            pVVar5->nSize = iVar18 + 1;
            pcVar12[iVar18] = cVar2;
            lVar21 = lVar21 + 1;
          } while (lVar21 != 2);
        }
        iVar18 = pVVar5->nSize;
        if (iVar10 + 0x46 < iVar18) {
          lVar21 = 0;
          iVar10 = iVar18;
          while( true ) {
            cVar2 = "module %s (\n    "[lVar21 + 0xb];
            if (iVar10 == pVVar5->nCap) {
              if (iVar10 < 0x10) {
                if (pVVar5->pArray == (char *)0x0) {
                  pcVar12 = (char *)malloc(0x10);
                }
                else {
                  pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
                }
                pVVar5->pArray = pcVar12;
                pVVar5->nCap = 0x10;
              }
              else {
                uVar9 = iVar10 * 2;
                if (pVVar5->pArray == (char *)0x0) {
                  pcVar12 = (char *)malloc((ulong)uVar9);
                }
                else {
                  pcVar12 = (char *)realloc(pVVar5->pArray,(ulong)uVar9);
                }
                pVVar5->pArray = pcVar12;
                pVVar5->nCap = uVar9;
              }
            }
            else {
              pcVar12 = pVVar5->pArray;
            }
            iVar10 = pVVar5->nSize;
            pVVar5->nSize = iVar10 + 1;
            pcVar12[iVar10] = cVar2;
            iVar10 = iVar18;
            if (lVar21 == 4) break;
            iVar10 = pVVar5->nSize;
            lVar21 = lVar21 + 1;
          }
        }
        Bac_ManWriteVar((Bac_Ntk_t *)p->pDesign->pStrs,(int)p->pDesign->vOut);
        iVar18 = (p->vInfo).nSize;
      }
      iVar11 = (int)lVar20;
      lVar20 = lVar20 + 3;
    } while (iVar11 + 5 < iVar18);
  }
  lVar20 = 0;
  do {
    cVar2 = "\n  );\n"[lVar20];
    uVar9 = pVVar5->nSize;
    if (uVar9 == pVVar5->nCap) {
      if ((int)uVar9 < 0x10) {
        if (pVVar5->pArray == (char *)0x0) {
          pcVar12 = (char *)malloc(0x10);
        }
        else {
          pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
        }
        pVVar5->pArray = pcVar12;
        pVVar5->nCap = 0x10;
      }
      else {
        sVar13 = (ulong)uVar9 * 2;
        if (pVVar5->pArray == (char *)0x0) {
          pcVar12 = (char *)malloc(sVar13);
        }
        else {
          pcVar12 = (char *)realloc(pVVar5->pArray,sVar13);
        }
        pVVar5->pArray = pcVar12;
        pVVar5->nCap = (int)sVar13;
      }
    }
    else {
      pcVar12 = pVVar5->pArray;
    }
    iVar18 = pVVar5->nSize;
    pVVar5->nSize = iVar18 + 1;
    pcVar12[iVar18] = cVar2;
    lVar20 = lVar20 + 1;
  } while (lVar20 != 6);
  iVar18 = (p->vInfo).nSize;
  if (2 < iVar18) {
    lVar20 = 0;
    do {
      piVar6 = (p->vInfo).pArray;
      uVar9 = piVar6[lVar20];
      if ((int)uVar9 < 0) {
LAB_003a33bd:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                      ,0x13e,"int Abc_Lit2Att2(int)");
      }
      if ((uVar9 & 3) != 0) {
        iVar18 = piVar6[lVar20 + 1];
        iVar10 = piVar6[lVar20 + 2];
        lVar21 = 0;
        do {
          cVar2 = "\nmodule %s (\n  "[lVar21 + 0xd];
          uVar4 = pVVar5->nSize;
          if (uVar4 == pVVar5->nCap) {
            if ((int)uVar4 < 0x10) {
              if (pVVar5->pArray == (char *)0x0) {
                pcVar12 = (char *)malloc(0x10);
              }
              else {
                pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
              }
              pVVar5->pArray = pcVar12;
              pVVar5->nCap = 0x10;
            }
            else {
              sVar13 = (ulong)uVar4 * 2;
              if (pVVar5->pArray == (char *)0x0) {
                pcVar12 = (char *)malloc(sVar13);
              }
              else {
                pcVar12 = (char *)realloc(pVVar5->pArray,sVar13);
              }
              pVVar5->pArray = pcVar12;
              pVVar5->nCap = (int)sVar13;
            }
          }
          else {
            pcVar12 = pVVar5->pArray;
          }
          iVar11 = pVVar5->nSize;
          pVVar5->nSize = iVar11 + 1;
          pcVar12[iVar11] = cVar2;
          lVar21 = lVar21 + 1;
        } while (lVar21 != 2);
        pcVar12 = *(char **)(&DAT_00b88fe0 + ((ulong)uVar9 & 3) * 8);
        sVar13 = strlen(pcVar12);
        if (0 < (int)(uint)sVar13) {
          uVar19 = 0;
          do {
            cVar2 = pcVar12[uVar19];
            uVar9 = pVVar5->nSize;
            if (uVar9 == pVVar5->nCap) {
              if ((int)uVar9 < 0x10) {
                if (pVVar5->pArray == (char *)0x0) {
                  pcVar14 = (char *)malloc(0x10);
                }
                else {
                  pcVar14 = (char *)realloc(pVVar5->pArray,0x10);
                }
                pVVar5->pArray = pcVar14;
                pVVar5->nCap = 0x10;
              }
              else {
                sVar7 = (ulong)uVar9 * 2;
                if (pVVar5->pArray == (char *)0x0) {
                  pcVar14 = (char *)malloc(sVar7);
                }
                else {
                  pcVar14 = (char *)realloc(pVVar5->pArray,sVar7);
                }
                pVVar5->pArray = pcVar14;
                pVVar5->nCap = (int)sVar7;
              }
            }
            else {
              pcVar14 = pVVar5->pArray;
            }
            iVar11 = pVVar5->nSize;
            pVVar5->nSize = iVar11 + 1;
            pcVar14[iVar11] = cVar2;
            uVar19 = uVar19 + 1;
          } while (((uint)sVar13 & 0x7fffffff) != uVar19);
        }
        if (-1 < iVar18) {
          Bac_ManWriteRange((Bac_Ntk_t *)p->pDesign->vOut,iVar18,iVar10);
        }
        Bac_ManWriteVar((Bac_Ntk_t *)p->pDesign->pStrs,(int)p->pDesign->vOut);
        lVar21 = 0;
        do {
          cVar2 = " .%s(%s) ) ;\n"[lVar21 + 0xb];
          uVar9 = pVVar5->nSize;
          if (uVar9 == pVVar5->nCap) {
            if ((int)uVar9 < 0x10) {
              if (pVVar5->pArray == (char *)0x0) {
                pcVar12 = (char *)malloc(0x10);
              }
              else {
                pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
              }
              pVVar5->pArray = pcVar12;
              pVVar5->nCap = 0x10;
            }
            else {
              sVar13 = (ulong)uVar9 * 2;
              if (pVVar5->pArray == (char *)0x0) {
                pcVar12 = (char *)malloc(sVar13);
              }
              else {
                pcVar12 = (char *)realloc(pVVar5->pArray,sVar13);
              }
              pVVar5->pArray = pcVar12;
              pVVar5->nCap = (int)sVar13;
            }
          }
          else {
            pcVar12 = pVVar5->pArray;
          }
          iVar18 = pVVar5->nSize;
          pVVar5->nSize = iVar18 + 1;
          pcVar12[iVar18] = cVar2;
          lVar21 = lVar21 + 1;
        } while (lVar21 != 2);
        iVar18 = (p->vInfo).nSize;
      }
      iVar10 = (int)lVar20;
      lVar20 = lVar20 + 3;
    } while (iVar10 + 5 < iVar18);
  }
  uVar9 = pVVar5->nSize;
  if (uVar9 == pVVar5->nCap) {
    if ((int)uVar9 < 0x10) {
      if (pVVar5->pArray == (char *)0x0) {
        pcVar12 = (char *)malloc(0x10);
      }
      else {
        pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
      }
      pVVar5->pArray = pcVar12;
      pVVar5->nCap = 0x10;
    }
    else {
      sVar13 = (ulong)uVar9 * 2;
      if (pVVar5->pArray == (char *)0x0) {
        pcVar12 = (char *)malloc(sVar13);
      }
      else {
        pcVar12 = (char *)realloc(pVVar5->pArray,sVar13);
      }
      pVVar5->pArray = pcVar12;
      pVVar5->nCap = (int)sVar13;
    }
  }
  else {
    pcVar12 = pVVar5->pArray;
  }
  iVar18 = pVVar5->nSize;
  pVVar5->nSize = iVar18 + 1;
  pcVar12[iVar18] = '\n';
  iVar18 = (p->vType).nSize;
  if (0 < iVar18) {
    uVar16 = 1;
    uVar19 = 0;
    do {
      bVar3 = (p->vType).pArray[uVar19];
      uVar1 = uVar19 + 1;
      if ((((byte)(bVar3 - 0x14) < 0xf8) && ((bVar3 >> 1) - 5 < 0x44)) &&
         ((long)uVar1 < (long)iVar18)) {
        bVar3 = (p->vType).pArray[uVar16];
        uVar8 = uVar16;
        while ((bVar3 & 0xfe) == 8) {
          iVar18 = (int)uVar8;
          uVar9 = Bac_ObjName(p,iVar18);
          if (uVar9 == 0) goto LAB_003a33dc;
          if ((int)uVar9 < 0) goto LAB_003a33bd;
          if ((uVar9 & 3) == 1) {
LAB_003a2c5e:
            lVar20 = 0;
            do {
              cVar2 = ";\n  wire "[lVar20 + 2];
              uVar9 = pVVar5->nSize;
              if (uVar9 == pVVar5->nCap) {
                if ((int)uVar9 < 0x10) {
                  if (pVVar5->pArray == (char *)0x0) {
                    pcVar12 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
                  }
                  pVVar5->pArray = pcVar12;
                  pVVar5->nCap = 0x10;
                }
                else {
                  sVar13 = (ulong)uVar9 * 2;
                  if (pVVar5->pArray == (char *)0x0) {
                    pcVar12 = (char *)malloc(sVar13);
                  }
                  else {
                    pcVar12 = (char *)realloc(pVVar5->pArray,sVar13);
                  }
                  pVVar5->pArray = pcVar12;
                  pVVar5->nCap = (int)sVar13;
                }
              }
              else {
                pcVar12 = pVVar5->pArray;
              }
              iVar10 = pVVar5->nSize;
              pVVar5->nSize = iVar10 + 1;
              pcVar12[iVar10] = cVar2;
              lVar20 = lVar20 + 1;
            } while (lVar20 != 7);
            iVar10 = Bac_ManFindRealIndex(p,iVar18);
            iVar11 = Bac_ObjGetRange(p,iVar18);
            iVar11 = Bac_ManFindRealIndex(p,(int)uVar19 + iVar11);
            Bac_ManWriteRange((Bac_Ntk_t *)p->pDesign->vOut,iVar10,iVar11);
            Bac_ManFindRealNameId(p,iVar18);
            Bac_ManWriteVar((Bac_Ntk_t *)p->pDesign->pStrs,(int)p->pDesign->vOut);
            lVar20 = 0;
            do {
              cVar2 = " .%s(%s) ) ;\n"[lVar20 + 0xb];
              uVar9 = pVVar5->nSize;
              if (uVar9 == pVVar5->nCap) {
                if ((int)uVar9 < 0x10) {
                  if (pVVar5->pArray == (char *)0x0) {
                    pcVar12 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
                  }
                  pVVar5->pArray = pcVar12;
                  pVVar5->nCap = 0x10;
                }
                else {
                  sVar13 = (ulong)uVar9 * 2;
                  if (pVVar5->pArray == (char *)0x0) {
                    pcVar12 = (char *)malloc(sVar13);
                  }
                  else {
                    pcVar12 = (char *)realloc(pVVar5->pArray,sVar13);
                  }
                  pVVar5->pArray = pcVar12;
                  pVVar5->nCap = (int)sVar13;
                }
              }
              else {
                pcVar12 = pVVar5->pArray;
              }
              iVar18 = pVVar5->nSize;
              pVVar5->nSize = iVar18 + 1;
              pcVar12[iVar18] = cVar2;
              lVar20 = lVar20 + 1;
            } while (lVar20 != 2);
          }
          else {
            uVar9 = Bac_ObjName(p,iVar18);
            if (uVar9 == 0) goto LAB_003a33dc;
            if ((int)uVar9 < 0) goto LAB_003a33bd;
            if ((uVar9 & 3) == 2) goto LAB_003a2c5e;
          }
          uVar15 = uVar8 + 1;
          iVar18 = (p->vType).nSize;
          if (iVar18 <= (int)uVar15) break;
          uVar19 = uVar8 & 0xffffffff;
          uVar8 = uVar15;
          bVar3 = (p->vType).pArray[uVar15];
        }
      }
      uVar16 = uVar16 + 1;
      uVar19 = uVar1;
    } while ((long)uVar1 < (long)iVar18);
    if (0 < iVar18) {
      uVar19 = 0;
      lVar20 = 1;
      do {
        bVar3 = (p->vType).pArray[uVar19];
        if (((byte)(bVar3 - 0x14) < 0xf8) && (lVar21 = lVar20, (bVar3 >> 1) - 5 < 0x44)) {
          do {
            iVar18 = (p->vType).nSize;
            if ((iVar18 <= (int)lVar21) || (((p->vType).pArray[lVar21] & 0xfeU) != 8))
            goto LAB_003a2e86;
            uVar9 = Bac_ObjName(p,(int)lVar21);
            if (uVar9 == 0) goto LAB_003a33dc;
            if ((int)uVar9 < 0) goto LAB_003a33bd;
            lVar21 = lVar21 + 1;
          } while ((uVar9 & 3) != 0);
          lVar20 = 0;
          do {
            cVar2 = ";\n  wire "[lVar20 + 1];
            uVar9 = pVVar5->nSize;
            if (uVar9 == pVVar5->nCap) {
              if ((int)uVar9 < 0x10) {
                if (pVVar5->pArray == (char *)0x0) {
                  pcVar12 = (char *)malloc(0x10);
                }
                else {
                  pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
                }
                pVVar5->pArray = pcVar12;
                pVVar5->nCap = 0x10;
              }
              else {
                sVar13 = (ulong)uVar9 * 2;
                if (pVVar5->pArray == (char *)0x0) {
                  pcVar12 = (char *)malloc(sVar13);
                }
                else {
                  pcVar12 = (char *)realloc(pVVar5->pArray,sVar13);
                }
                pVVar5->pArray = pcVar12;
                pVVar5->nCap = (int)sVar13;
              }
            }
            else {
              pcVar12 = pVVar5->pArray;
            }
            iVar18 = pVVar5->nSize;
            pVVar5->nSize = iVar18 + 1;
            pcVar12[iVar18] = cVar2;
            lVar20 = lVar20 + 1;
          } while (lVar20 != 8);
          iVar18 = (p->vType).nSize;
          if (0 < iVar18) {
            iVar10 = 7;
            local_40 = 1;
            lVar20 = 0;
            do {
              bVar3 = (p->vType).pArray[lVar20];
              lVar20 = lVar20 + 1;
              if ((((byte)(bVar3 - 0x14) < 0xf8) && ((bVar3 >> 1) - 5 < 0x44)) && (lVar20 < iVar18))
              {
                bVar3 = (p->vType).pArray[local_40];
                lVar21 = local_40;
                while ((bVar3 & 0xfe) == 8) {
                  iVar18 = (int)lVar21;
                  uVar9 = Bac_ObjName(p,iVar18);
                  if (uVar9 == 0) {
LAB_003a33dc:
                    __assert_fail("n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                                  ,0x107,"Bac_NameType_t Bac_NameType(int)");
                  }
                  if ((int)uVar9 < 0) goto LAB_003a33bd;
                  if ((uVar9 & 3) == 0) {
                    if (iVar10 < 0x49) {
                      if (7 < iVar10) {
                        lVar17 = 0;
                        do {
                          cVar2 = "    \"%s\", "[lVar17 + 8];
                          uVar9 = pVVar5->nSize;
                          if (uVar9 == pVVar5->nCap) {
                            if ((int)uVar9 < 0x10) {
                              if (pVVar5->pArray == (char *)0x0) {
                                pcVar12 = (char *)malloc(0x10);
                              }
                              else {
                                pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
                              }
                              pVVar5->pArray = pcVar12;
                              pVVar5->nCap = 0x10;
                            }
                            else {
                              sVar13 = (ulong)uVar9 * 2;
                              if (pVVar5->pArray == (char *)0x0) {
                                pcVar12 = (char *)malloc(sVar13);
                              }
                              else {
                                pcVar12 = (char *)realloc(pVVar5->pArray,sVar13);
                              }
                              pVVar5->pArray = pcVar12;
                              pVVar5->nCap = (int)sVar13;
                            }
                          }
                          else {
                            pcVar12 = pVVar5->pArray;
                          }
                          iVar11 = pVVar5->nSize;
                          pVVar5->nSize = iVar11 + 1;
                          pcVar12[iVar11] = cVar2;
                          lVar17 = lVar17 + 1;
                        } while (lVar17 != 2);
                      }
                    }
                    else {
                      lVar17 = 0;
                      do {
                        cVar2 = ";\n  wire "[lVar17];
                        uVar9 = pVVar5->nSize;
                        if (uVar9 == pVVar5->nCap) {
                          if ((int)uVar9 < 0x10) {
                            if (pVVar5->pArray == (char *)0x0) {
                              pcVar12 = (char *)malloc(0x10);
                            }
                            else {
                              pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
                            }
                            pVVar5->pArray = pcVar12;
                            pVVar5->nCap = 0x10;
                          }
                          else {
                            sVar13 = (ulong)uVar9 * 2;
                            if (pVVar5->pArray == (char *)0x0) {
                              pcVar12 = (char *)malloc(sVar13);
                            }
                            else {
                              pcVar12 = (char *)realloc(pVVar5->pArray,sVar13);
                            }
                            pVVar5->pArray = pcVar12;
                            pVVar5->nCap = (int)sVar13;
                          }
                        }
                        else {
                          pcVar12 = pVVar5->pArray;
                        }
                        iVar10 = pVVar5->nSize;
                        pVVar5->nSize = iVar10 + 1;
                        pcVar12[iVar10] = cVar2;
                        lVar17 = lVar17 + 1;
                      } while (lVar17 != 9);
                      iVar10 = 7;
                    }
                    pcVar12 = Bac_ObjNameStr(p,iVar18);
                    sVar13 = strlen(pcVar12);
                    if (0 < (int)(uint)sVar13) {
                      uVar19 = 0;
                      do {
                        cVar2 = pcVar12[uVar19];
                        uVar9 = pVVar5->nSize;
                        if (uVar9 == pVVar5->nCap) {
                          if ((int)uVar9 < 0x10) {
                            if (pVVar5->pArray == (char *)0x0) {
                              pcVar14 = (char *)malloc(0x10);
                            }
                            else {
                              pcVar14 = (char *)realloc(pVVar5->pArray,0x10);
                            }
                            pVVar5->pArray = pcVar14;
                            pVVar5->nCap = 0x10;
                          }
                          else {
                            sVar7 = (ulong)uVar9 * 2;
                            if (pVVar5->pArray == (char *)0x0) {
                              pcVar14 = (char *)malloc(sVar7);
                            }
                            else {
                              pcVar14 = (char *)realloc(pVVar5->pArray,sVar7);
                            }
                            pVVar5->pArray = pcVar14;
                            pVVar5->nCap = (int)sVar7;
                          }
                        }
                        else {
                          pcVar14 = pVVar5->pArray;
                        }
                        iVar11 = pVVar5->nSize;
                        pVVar5->nSize = iVar11 + 1;
                        pcVar14[iVar11] = cVar2;
                        uVar19 = uVar19 + 1;
                      } while (((uint)sVar13 & 0x7fffffff) != uVar19);
                    }
                    pcVar12 = Bac_ObjNameStr(p,iVar18);
                    sVar13 = strlen(pcVar12);
                    iVar10 = iVar10 + (int)sVar13;
                  }
                  lVar21 = lVar21 + 1;
                  iVar18 = (p->vType).nSize;
                  if (iVar18 <= (int)lVar21) break;
                  bVar3 = (p->vType).pArray[lVar21];
                }
              }
              local_40 = local_40 + 1;
            } while (lVar20 < iVar18);
          }
          lVar20 = 0;
          do {
            cVar2 = " .%s(%s) ) ;\n"[lVar20 + 0xb];
            uVar9 = pVVar5->nSize;
            if (uVar9 == pVVar5->nCap) {
              if ((int)uVar9 < 0x10) {
                if (pVVar5->pArray == (char *)0x0) {
                  pcVar12 = (char *)malloc(0x10);
                }
                else {
                  pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
                }
                pVVar5->pArray = pcVar12;
                pVVar5->nCap = 0x10;
              }
              else {
                sVar13 = (ulong)uVar9 * 2;
                if (pVVar5->pArray == (char *)0x0) {
                  pcVar12 = (char *)malloc(sVar13);
                }
                else {
                  pcVar12 = (char *)realloc(pVVar5->pArray,sVar13);
                }
                pVVar5->pArray = pcVar12;
                pVVar5->nCap = (int)sVar13;
              }
            }
            else {
              pcVar12 = pVVar5->pArray;
            }
            iVar18 = pVVar5->nSize;
            pVVar5->nSize = iVar18 + 1;
            pcVar12[iVar18] = cVar2;
            lVar20 = lVar20 + 1;
          } while (lVar20 != 2);
          break;
        }
LAB_003a2e86:
        uVar9 = (int)uVar19 + 1;
        uVar19 = (ulong)uVar9;
        lVar20 = lVar20 + 1;
      } while ((int)uVar9 < iVar18);
    }
  }
  uVar9 = pVVar5->nSize;
  if (uVar9 == pVVar5->nCap) {
    if ((int)uVar9 < 0x10) {
      if (pVVar5->pArray == (char *)0x0) {
        pcVar12 = (char *)malloc(0x10);
      }
      else {
        pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
      }
      pVVar5->pArray = pcVar12;
      pVVar5->nCap = 0x10;
    }
    else {
      sVar13 = (ulong)uVar9 * 2;
      if (pVVar5->pArray == (char *)0x0) {
        pcVar12 = (char *)malloc(sVar13);
      }
      else {
        pcVar12 = (char *)realloc(pVVar5->pArray,sVar13);
      }
      pVVar5->pArray = pcVar12;
      pVVar5->nCap = (int)sVar13;
    }
  }
  else {
    pcVar12 = pVVar5->pArray;
  }
  iVar18 = pVVar5->nSize;
  pVVar5->nSize = iVar18 + 1;
  pcVar12[iVar18] = '\n';
  Bac_ManWriteVerilogBoxes(p,fUseAssign);
  lVar20 = 0;
  do {
    cVar2 = "\nendmodule\n\n"[lVar20 + 1];
    uVar9 = pVVar5->nSize;
    if (uVar9 == pVVar5->nCap) {
      if ((int)uVar9 < 0x10) {
        if (pVVar5->pArray == (char *)0x0) {
          pcVar12 = (char *)malloc(0x10);
        }
        else {
          pcVar12 = (char *)realloc(pVVar5->pArray,0x10);
        }
        pVVar5->pArray = pcVar12;
        pVVar5->nCap = 0x10;
      }
      else {
        sVar13 = (ulong)uVar9 * 2;
        if (pVVar5->pArray == (char *)0x0) {
          pcVar12 = (char *)malloc(sVar13);
        }
        else {
          pcVar12 = (char *)realloc(pVVar5->pArray,sVar13);
        }
        pVVar5->pArray = pcVar12;
        pVVar5->nCap = (int)sVar13;
      }
    }
    else {
      pcVar12 = pVVar5->pArray;
    }
    iVar18 = pVVar5->nSize;
    pVVar5->nSize = iVar18 + 1;
    pcVar12[iVar18] = cVar2;
    lVar20 = lVar20 + 1;
  } while (lVar20 != 0xb);
  return;
}

Assistant:

void Bac_ManWriteVerilogNtk( Bac_Ntk_t * p, int fUseAssign )
{
    char * pKeyword[4] = { "wire ", "input ", "output ", "inout " };
    Vec_Str_t * vStr = p->pDesign->vOut;
    int k, iObj, iTerm, Value, Beg, End, Length, fHaveWires, StartPos;
//    assert( Bac_NtkInfoNum(p) );
    assert( Vec_IntSize(&p->vFanin) == Bac_NtkObjNum(p) );
//    Bac_NtkPrint( p );
    // write header
    Vec_StrPrintStr( vStr, "module " );
    Vec_StrPrintStr( vStr, Bac_NtkName(p) );
    Vec_StrPrintStr( vStr, " (\n    " );
    StartPos = Vec_StrSize(vStr);
    Vec_IntForEachEntryTriple( &p->vInfo, Value, Beg, End, k )
    if ( Abc_Lit2Att2(Value) != 0 )
    {
        Vec_StrPrintStr( vStr, k ? ", " : "" );
        if ( Vec_StrSize(vStr) > StartPos + 70 )
        {
            StartPos = Vec_StrSize(vStr);
            Vec_StrPrintStr( vStr, "\n    " );
        }
        Bac_ManWriteVar( p, Abc_Lit2Var2(Value) );
    }
    Vec_StrPrintStr( vStr, "\n  );\n" );
    // write inputs/outputs
    Vec_IntForEachEntryTriple( &p->vInfo, Value, Beg, End, k )
    if ( Abc_Lit2Att2(Value) != 0 )
    {
        Vec_StrPrintStr( vStr, "  " );
        Vec_StrPrintStr( vStr, pKeyword[Abc_Lit2Att2(Value)] );
        if ( Beg >= 0 )
            Bac_ManWriteRange( p, Beg, End );
        Bac_ManWriteVar( p, Abc_Lit2Var2(Value) );
        Vec_StrPrintStr( vStr, ";\n" );
    }
    Vec_StrPrintStr( vStr, "\n" );
    // write word-level wires
    Bac_NtkForEachBox( p, iObj )
    if ( !Bac_ObjIsConst(p, iObj) )
        Bac_BoxForEachBo( p, iObj, iTerm, k )
        if ( Bac_ObjNameType(p, iTerm) == BAC_NAME_WORD || Bac_ObjNameType(p, iTerm) == BAC_NAME_INFO )
        {
            Vec_StrPrintStr( vStr, "  wire " );
            Bac_ManWriteRange( p, Bac_ManFindRealIndex(p, iTerm), Bac_ManFindRealIndex(p, iTerm + Bac_ObjGetRange(p, iTerm) - 1) );
            Bac_ManWriteVar( p, Bac_ManFindRealNameId(p, iTerm) );
            Vec_StrPrintStr( vStr, ";\n" );
        }
    // check if there are any wires left
    fHaveWires = 0;
    Bac_NtkForEachBox( p, iObj )
    if ( !Bac_ObjIsConst(p, iObj) )
        Bac_BoxForEachBo( p, iObj, iTerm, k )
        if ( Bac_ObjNameType(p, iTerm) == BAC_NAME_BIN )
        { fHaveWires = 1; iObj = Bac_NtkObjNum(p); break; }
    // write bit-level wires
    if ( fHaveWires )
    {
        Length = 7;
        Vec_StrPrintStr( vStr, "\n  wire " );
        Bac_NtkForEachBox( p, iObj )
        if ( !Bac_ObjIsConst(p, iObj) )
            Bac_BoxForEachBo( p, iObj, iTerm, k )
            if ( Bac_ObjNameType(p, iTerm) == BAC_NAME_BIN )
            {
                if ( Length > 72 )
                    Vec_StrPrintStr( vStr, ";\n  wire " ), Length = 7;
                if ( Length > 7 )
                    Vec_StrPrintStr( vStr, ", " );
                Vec_StrPrintStr( vStr, Bac_ObjNameStr(p, iTerm) ); 
                Length += strlen(Bac_ObjNameStr(p, iTerm));
            }
        Vec_StrPrintStr( vStr, ";\n" );
    }
    Vec_StrPrintStr( vStr, "\n" );
    // write objects
    Bac_ManWriteVerilogBoxes( p, fUseAssign );
    Vec_StrPrintStr( vStr, "endmodule\n\n" );
}